

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmk.cpp
# Opt level: O2

bool ReadDMK(MemFile *file,shared_ptr<Disk> *disk)

{
  ushort uVar1;
  Disk *this;
  element_type *peVar2;
  uint3 uVar3;
  int iVar4;
  ulong uVar5;
  undefined8 uVar6;
  uint8_t uVar7;
  char extraout_AL;
  bool bVar8;
  int iVar9;
  uint uVar10;
  Encoding encoding;
  ssize_t sVar11;
  string *psVar12;
  LogHelper *pLVar13;
  BitBuffer *__buf;
  mapped_type *pmVar14;
  exception *this_00;
  size_t in_RCX;
  OPTIONS *__n;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  int pos;
  Encoding next_idam_encoding;
  int local_148;
  value_type b;
  uint local_13c;
  uint local_138;
  Encoding current_idam_encoding;
  uint local_130;
  uint local_12c;
  uint local_128;
  int local_124;
  uint local_120;
  int total_size;
  DMK_HEADER dh;
  int local_f8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<unsigned_short,_std::allocator<unsigned_short>_> index;
  BitstreamTrackBuilder bitbuf;
  
  dh.protect = '\0';
  dh.cyls = '\0';
  dh.tracklen = 0;
  dh.flags = '\0';
  dh.reserved[0] = '\0';
  dh.reserved[1] = '\0';
  dh.reserved[2] = '\0';
  dh.reserved[3] = '\0';
  dh.reserved[4] = '\0';
  dh.reserved[5] = '\0';
  dh.reserved[6] = '\0';
  dh.realsig = 0;
  MemFile::rewind(file,(FILE *)disk);
  if (((extraout_AL == '\0') ||
      (sVar11 = MemFile::read(file,(int)&dh,(void *)0x10,in_RCX), uVar6 = dh._0_8_,
      (char)sVar11 == '\0')) || ((byte)(dh.protect - 1) < 0xfe)) {
    return false;
  }
  if (dh.realsig == 0x12345678) {
    this_00 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[51]>
              (this_00,(char (*) [51])"DMK real-disk-specification images contain no data");
  }
  else {
    uVar7 = dh.flags;
    uVar5 = dh._0_8_ & 0x1000000000;
    uVar18 = (ulong)dh.tracklen;
    if ((ushort)(dh.tracklen + 0xc000) < 0xc001 || dh.cyls == '\0') {
      return false;
    }
    local_130 = (uint)dh.cyls;
    total_size = (dh.tracklen * local_130 << ((byte)((dh.flags & 0x10) >> 4) ^ 1)) + 0x10;
    iVar9 = MemFile::size(file);
    if (iVar9 != total_size) {
      psVar12 = MemFile::name_abi_cxx11_(file);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&bitbuf,"dmk",(allocator<char> *)&data);
      bVar8 = IsFileExt(psVar12,(string *)&bitbuf);
      if (bVar8) {
        std::__cxx11::string::~string((string *)&bitbuf);
      }
      else {
        psVar12 = MemFile::name_abi_cxx11_(file);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&index,"dsk",(allocator<char> *)&b);
        bVar8 = IsFileExt(psVar12,(string *)&index);
        std::__cxx11::string::~string((string *)&index);
        std::__cxx11::string::~string((string *)&bitbuf);
        if (!bVar8) {
          return false;
        }
      }
      iVar9 = MemFile::size(file);
      bitbuf.super_TrackBuilder._vptr_TrackBuilder =
           (_func_int **)CONCAT44(bitbuf.super_TrackBuilder._vptr_TrackBuilder._4_4_,iVar9);
      Message<int,int&>(msgWarning,"DMK size (%d) doesn\'t match calculated size (%d)",
                        (int *)&bitbuf,&total_size);
    }
    if (-1 < (char)uVar7) {
      uVar16 = 0;
      local_120 = ((uVar6 & 0x4000000000) == 0) + 1;
      uVar10 = local_130;
      do {
        if (uVar16 == uVar10) {
          peVar2 = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&bitbuf,"protect",(allocator<char> *)&index);
          pmVar14 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[](&peVar2->metadata,(key_type *)&bitbuf);
          std::__cxx11::string::assign((char *)pmVar14);
          std::__cxx11::string::~string((string *)&bitbuf);
          std::__cxx11::string::assign
                    ((char *)&((disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                              ->strType);
          return true;
        }
        __n = (OPTIONS *)0x0;
        local_12c = uVar16;
LAB_0018b938:
        local_148 = (int)__n;
        if (local_148 != (uVar5 == 0) + 1) {
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                    (&index,0x40,(allocator_type *)&bitbuf);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                    (&data,uVar18 - 0x80,(allocator_type *)&bitbuf);
          bVar8 = MemFile::read<std::vector<unsigned_short,std::allocator<unsigned_short>>>
                            (file,&index);
          if ((!bVar8) ||
             (bVar8 = MemFile::read<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                                (file,&data), !bVar8)) {
            bitbuf.super_TrackBuilder._vptr_TrackBuilder = (_func_int **)CH(uVar16,local_148);
            Message<char_const*>(msgWarning,"short file reading %s",(char **)&bitbuf);
          }
          pos = 0;
          uVar1 = *index.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                   .super__Vector_impl_data._M_start;
          uVar10 = local_120;
          if ((short)uVar1 < 1) {
            uVar10 = 1;
          }
          next_idam_encoding = (0 < (short)uVar1) + MFM;
          current_idam_encoding = next_idam_encoding;
          BitstreamTrackBuilder::BitstreamTrackBuilder(&bitbuf,_250K,next_idam_encoding);
          if (opt.debug != 0) {
            pLVar13 = util::operator<<((LogHelper *)&util::cout,(char (*) [6])"DMK: ");
            CylHead::CylHead((CylHead *)&b,local_12c,local_148);
            pLVar13 = util::operator<<(pLVar13,(CylHead *)&b);
            util::operator<<(pLVar13,(char (*) [2])0x1a83c6);
          }
          local_124 = 0;
          iVar9 = 0;
          local_138 = 0;
          local_128 = 0;
          do {
            uVar16 = (uVar1 & 0x3fff) - 0x80;
            local_13c = 0;
LAB_0018ba62:
            local_f8 = (int)(uVar18 - 0x80);
            if (local_f8 <= pos) goto LAB_0018bd83;
            b = data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start[pos];
            uVar3 = (uint3)((uint)pos >> 8);
            __n = (OPTIONS *)CONCAT71((int7)(int3)uVar3,b);
            if (pos < (int)uVar16 || (int)uVar16 < 1) {
              if ((((local_128 & 1) == 0) && (b == 0xfc)) && (local_138 == 0)) {
                local_128 = (uint)CONCAT71((uint7)uVar3,1);
                if (opt.debug != 0) {
                  pLVar13 = util::operator<<((LogHelper *)&util::cout,&next_idam_encoding);
                  pLVar13 = util::operator<<(pLVar13,(char (*) [16])" IAM at offset ");
                  pLVar13 = util::operator<<(pLVar13,&pos);
                  util::operator<<(pLVar13,(char (*) [2])0x1a83c6);
                }
                goto LAB_0018bba1;
              }
              bVar8 = (byte)(b + 2) < 0xfa;
              __n = (OPTIONS *)CONCAT71((int7)(int3)uVar3,bVar8 | (byte)local_13c);
              if (!bVar8 && (local_13c & 1) == 0) {
                __n = (OPTIONS *)(ulong)current_idam_encoding;
                iVar4 = 7;
                if (current_idam_encoding == MFM) {
                  iVar4 = 0xe;
                }
                iVar15 = pos - local_138;
                if (local_138 == 0) {
                  iVar15 = 0;
                }
                if ((int)(iVar4 * uVar10) <= iVar15) {
                  iVar4 = 0x25;
                  if (current_idam_encoding == MFM) {
                    iVar4 = 0x39;
                  }
                  __n = (OPTIONS *)(ulong)(iVar4 * uVar10);
                  if (iVar15 <= (int)(iVar4 * uVar10)) {
                    local_13c = (uint)CONCAT71((uint7)uVar3,1);
                    if (opt.debug != 0) {
                      pLVar13 = util::operator<<((LogHelper *)&util::cout,&current_idam_encoding);
                      pLVar13 = util::operator<<(pLVar13,(char (*) [7])" DAM (");
                      pLVar13 = util::operator<<(pLVar13,&b);
                      pLVar13 = util::operator<<(pLVar13,(char (*) [13])") at offset ");
                      pLVar13 = util::operator<<(pLVar13,&pos);
                      util::operator<<(pLVar13,(char (*) [2])0x1a83c6);
                    }
                    goto LAB_0018bba1;
                  }
                }
              }
              pos = pos + uVar10;
              goto LAB_0018ba62;
            }
            b = data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start[uVar16];
            __n = &opt;
            pos = uVar16;
            if (opt.debug != 0) {
              pLVar13 = util::operator<<((LogHelper *)&util::cout,&next_idam_encoding);
              pLVar13 = util::operator<<(pLVar13,(char (*) [8])" IDAM (");
              uVar17 = (ulong)(uint)(3 << (uVar7 >> 6 ^ 1));
              if (next_idam_encoding == MFM) {
                uVar17 = 3;
              }
              __n = (OPTIONS *)(long)pos;
              pLVar13 = util::operator<<(pLVar13,data.
                                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                 ._M_impl.super__Vector_impl_data._M_start +
                                                 (long)&(__n->range).cyl_begin + uVar17);
              pLVar13 = util::operator<<(pLVar13,(char (*) [13])") at offset ");
              pLVar13 = util::operator<<(pLVar13,&pos);
              util::operator<<(pLVar13,(char (*) [2])0x1a83c6);
            }
            if (b != 0xfe) {
              __assert_fail("b == IBM_IDAM",
                            "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/types/dmk.cpp"
                            ,0x6f,"bool ReadDMK(MemFile &, std::shared_ptr<Disk> &)");
            }
LAB_0018bba1:
            encoding = next_idam_encoding;
            if (b != 0xfe) {
              encoding = BitstreamTrackBuilder::encoding(&bitbuf);
            }
            for (lVar19 = (long)iVar9; lVar19 < (int)(pos + (encoding == MFM | 0xfffffff4));
                lVar19 = lVar19 + (ulong)uVar10) {
              TrackBuilder::addByte
                        (&bitbuf.super_TrackBuilder,
                         (uint)data.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar19]);
            }
            BitstreamTrackBuilder::setEncoding(&bitbuf,encoding);
            TrackBuilder::addBlock(&bitbuf.super_TrackBuilder,0,(uint)(encoding == MFM) * 2 + 6);
            TrackBuilder::addAM(&bitbuf.super_TrackBuilder,(uint)b,true);
            uVar10 = local_120;
            if (encoding == MFM) {
              uVar10 = 1;
            }
            iVar9 = pos + uVar10;
            pos = iVar9;
            if (b != 0xfe) {
              __n = (OPTIONS *)CONCAT71((int7)((ulong)__n >> 8),encoding != FM);
              if (b == 0xfd && encoding == FM) {
                uVar10 = 1;
                BitstreamTrackBuilder::setEncoding(&bitbuf,MFM);
              }
              goto LAB_0018ba62;
            }
            current_idam_encoding = next_idam_encoding;
            lVar19 = (long)local_124;
            local_124 = local_124 + 1;
            uVar1 = index.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar19 + 1];
            next_idam_encoding = (0 < (short)uVar1) + MFM;
            __n = (OPTIONS *)(ulong)next_idam_encoding;
            local_138 = uVar16;
          } while( true );
        }
        uVar16 = uVar16 + 1;
      } while( true );
    }
    this_00 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[51]>
              (this_00,(char (*) [51])"DMK ignore density flag is not currently supported");
  }
  __cxa_throw(this_00,&util::exception::typeinfo,std::runtime_error::~runtime_error);
LAB_0018bd83:
  for (lVar19 = (long)iVar9; uVar16 = local_12c, lVar19 < pos; lVar19 = lVar19 + (ulong)uVar10) {
    TrackBuilder::addByte
              (&bitbuf.super_TrackBuilder,
               (uint)data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar19]);
  }
  this = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  CylHead::CylHead((CylHead *)&b,local_12c,local_148);
  __buf = BitstreamTrackBuilder::buffer(&bitbuf);
  Disk::write(this,(int)(CylHead *)&b,__buf,(size_t)__n);
  BitBuffer::~BitBuffer(&bitbuf.m_buffer);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&index.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  __n = (OPTIONS *)(ulong)(local_148 + 1);
  uVar10 = local_130;
  goto LAB_0018b938;
}

Assistant:

bool ReadDMK(MemFile& file, std::shared_ptr<Disk>& disk)
{
    DMK_HEADER dh{};
    if (!file.rewind() || !file.read(&dh, sizeof(dh)))
        return false;
    else if ((dh.protect != 0x00 && dh.protect != 0xff))
        return false;

    bool ignore_density = (dh.flags & 0x80) != 0;
    bool single_density = (dh.flags & 0x40) != 0;
    bool single_sided = (dh.flags & 0x10) != 0;

    if (util::letoh(dh.realsig) == 0x12345678)
        throw util::exception("DMK real-disk-specification images contain no data");

    auto cyls = dh.cyls;
    auto heads = single_sided ? 1 : 2;
    int tracklen = util::letoh(dh.tracklen);
    if (!cyls || !tracklen || tracklen > DMK_MAX_TRACK_LENGTH)
        return false;

    auto total_size = static_cast<int>(sizeof(DMK_HEADER) + tracklen * cyls * heads);
    if (file.size() != total_size)
    {
        // Accept wrong size only if the extension is recognised.
        if (!IsFileExt(file.name(), "dmk") && !IsFileExt(file.name(), "dsk"))
            return false;

        Message(msgWarning, "DMK size (%d) doesn't match calculated size (%d)",
            file.size(), total_size);
    }

    if (ignore_density)
        throw util::exception("DMK ignore density flag is not currently supported");

    tracklen -= DMK_TRACK_INDEX_SIZE;

    for (auto cyl = 0; cyl < cyls; ++cyl)
    {
        for (auto head = 0; head < heads; ++head)
        {
            std::vector<uint16_t> index(64);
            std::vector<uint8_t> data(tracklen);

            if (!file.read(index) || !file.read(data))
                Message(msgWarning, "short file reading %s", CH(cyl, head));

            std::transform(index.begin(), index.end(), index.begin(),
                [](uint16_t w) { return util::letoh(w); });

            int idx_idam = 0;
            int pos = 0;
            int last_pos = pos;

            int current_idam_pos = 0;
            int next_idam_pos = (index[0] & 0x3fff) - DMK_TRACK_INDEX_SIZE;

            auto next_idam_encoding =
                (!index[0] || (index[0] & 0x8000)) ? Encoding::MFM : Encoding::FM;
            auto current_idam_encoding = next_idam_encoding;

            int fm_step = single_density ? 1 : 2;
            int step = (current_idam_encoding == Encoding::MFM) ? 1 : fm_step;

            bool found_iam = false;
            bool found_dam = false;

            BitstreamTrackBuilder bitbuf(DataRate::_250K, current_idam_encoding);
            if (opt.debug)
                util::cout << "DMK: " << CylHead(cyl, head) << "\n";

            while (pos < tracklen)
            {
                auto b = data[pos];
                bool is_am = false;

                if (next_idam_pos > 0 && pos >= next_idam_pos)
                {
                    // Force sync in case of odd/even mismatch.
                    pos = next_idam_pos;
                    b = data[pos];

                    if (opt.debug)
                    {
                        util::cout << next_idam_encoding << " IDAM (" <<
                            data[pos + 3 * ((next_idam_encoding == Encoding::MFM) ? 1 : fm_step)] <<
                            ") at offset " << pos << "\n";
                    }

                    assert(b == IBM_IDAM);
                    is_am = true;
                }
                else if (!found_iam && b == IBM_IAM && current_idam_pos == 0)
                {
                    if (opt.debug)
                        util::cout << next_idam_encoding << " IAM at offset " << pos << "\n";

                    is_am = found_iam = true;
                }
                else if (!found_dam && b >= 0xf8 && b <= 0xfd)
                {
                    auto min_distance = ((current_idam_encoding == Encoding::MFM) ? 14 : 7) * step;
                    auto max_distance = min_distance + ((current_idam_encoding == Encoding::MFM) ? 43 : 30) * step;
                    auto idam_distance = current_idam_pos ? (pos - current_idam_pos) : 0;

                    if (idam_distance >= min_distance && idam_distance <= max_distance)
                    {
                        if (opt.debug)
                            util::cout << current_idam_encoding << " DAM (" << b << ") at offset " << pos << "\n";

                        is_am = found_dam = true;
                    }
                }

                if (is_am)
                {
                    auto am_encoding = (b == IBM_IDAM) ? next_idam_encoding : bitbuf.encoding();
                    int rewind = (am_encoding == Encoding::MFM) ? (8 + 3) : (6 * 2);

                    while (last_pos < (pos - rewind))
                    {
                        bitbuf.addByte(data[last_pos]);
                        last_pos += step;
                    }

                    // Rewrite minimal sync and the address mark with missing clock bits
                    bitbuf.setEncoding(am_encoding);
                    bitbuf.addBlock(0x00, (am_encoding == Encoding::MFM) ? 8 : 6);
                    bitbuf.addAM(b, true);

                    step = (am_encoding == Encoding::MFM) ? 1 : fm_step;
                    pos += step;
                    last_pos = pos;

                    if (b == IBM_IDAM)
                    {
                        current_idam_pos = next_idam_pos;
                        current_idam_encoding = next_idam_encoding;
                        found_dam = false;

                        auto idam_entry = index[++idx_idam];
                        next_idam_pos = (idam_entry & 0x3fff) - 0x80;
                        next_idam_encoding = (!idam_entry || (idam_entry & 0x8000)) ? Encoding::MFM : Encoding::FM;
                    }
                    else if (am_encoding == Encoding::FM && b == IBM_DAM_RX02)
                    {
                        bitbuf.setEncoding(Encoding::MFM);
                        step = 1;
                    }

                    continue;
                }

                pos += step;
            }

            while (last_pos < pos)
            {
                bitbuf.addByte(data[last_pos]);
                last_pos += step;
            }

            disk->write(CylHead(cyl, head), std::move(bitbuf.buffer()));
        }
    }

    disk->metadata["protect"] = dh.protect ? "read-only" : "read-write";

    disk->strType = "DMK";
    return true;
}